

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::base64_encode(string *__return_storage_ptr__,string *in)

{
  bool bVar1;
  ulong uVar2;
  char cVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  int valb;
  int val;
  string *in_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __range2._4_4_ = -6;
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_50._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0);
    cVar3 = (char)__return_storage_ptr__;
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&__end2);
    for (__range2._4_4_ = __range2._4_4_ + 8; -1 < __range2._4_4_;
        __range2._4_4_ = __range2._4_4_ + -6) {
      std::__cxx11::string::push_back(cVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  if (-6 < __range2._4_4_) {
    std::__cxx11::string::push_back(cVar3);
  }
  while (uVar2 = std::__cxx11::string::size(), (uVar2 & 3) != 0) {
    std::__cxx11::string::push_back(cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64_encode(const std::string &in) {
			static const auto lookup =
					"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

			std::string out;
			out.reserve(in.size());

			int val = 0;
			int valb = -6;

			for (auto c : in) {
				val = (val << 8) + static_cast<uint8_t>(c);
				valb += 8;
				while (valb >= 0) {
					out.push_back(lookup[(val >> valb) & 0x3F]);
					valb -= 6;
				}
			}

			if (valb > -6) { out.push_back(lookup[((val << 8) >> (valb + 8)) & 0x3F]); }

			while (out.size() % 4) {
				out.push_back('=');
			}

			return out;
		}